

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<duckdb::uhugeint_t,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  _func_int *p_Var1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pSVar8;
  ulong uVar9;
  ulong uVar10;
  data_ptr_t pdVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uhugeint_t element;
  
  pSVar8 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar8 + 3));
  p_Var3 = pSVar8[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar8[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar15 = scan_count + result_offset;
  do {
    uVar9 = uVar15 - result_offset;
    if (uVar15 < result_offset || uVar9 == 0) {
      return;
    }
    pp_Var12 = (_func_int **)
               (ulong)*(ushort *)
                       (p_Var3 + (long)pSVar8[4]._vptr_SegmentScanState * 2 + uVar2 + iVar4);
    uVar10 = (long)pp_Var12 - (long)pSVar8[5]._vptr_SegmentScanState;
    p_Var1 = p_Var3 + (long)pSVar8[4]._vptr_SegmentScanState * 0x10 + iVar4 + 8;
    uVar6 = *(undefined8 *)p_Var1;
    uVar7 = *(undefined8 *)(p_Var1 + 8);
    if (uVar9 < uVar10) {
      pdVar11 = pdVar5 + result_offset * 0x10;
      lVar14 = uVar9 + (uVar9 == 0);
      do {
        *(undefined8 *)pdVar11 = uVar6;
        *(undefined8 *)(pdVar11 + 8) = uVar7;
        pdVar11 = pdVar11 + 0x10;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      pp_Var12 = (_func_int **)((long)pSVar8[5]._vptr_SegmentScanState + uVar9);
    }
    else {
      if (pp_Var12 != pSVar8[5]._vptr_SegmentScanState) {
        pdVar11 = pdVar5 + result_offset * 0x10;
        uVar13 = uVar10;
        do {
          *(undefined8 *)pdVar11 = uVar6;
          *(undefined8 *)(pdVar11 + 8) = uVar7;
          pdVar11 = pdVar11 + 0x10;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      result_offset = result_offset + uVar10;
      pSVar8[4]._vptr_SegmentScanState = (_func_int **)((long)pSVar8[4]._vptr_SegmentScanState + 1);
      pp_Var12 = (_func_int **)0x0;
    }
    pSVar8[5]._vptr_SegmentScanState = pp_Var12;
  } while (uVar10 <= uVar9);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}